

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

bool __thiscall Clasp::Solver::assume(Solver *this,Literal *p)

{
  bool bVar1;
  byte bVar2;
  DLevel local_28;
  
  bVar2 = *(byte *)((long)(this->assign_).assign_.ebo_.buf + (ulong)(p->rep_ & 0xfffffffc)) & 3;
  if (bVar2 != 0) {
    return bVar2 == (byte)(2U - ((p->rep_ & 2) == 0));
  }
  (this->stats).super_CoreStats.choices = (this->stats).super_CoreStats.choices + 1;
  local_28._0_8_ = CONCAT44(local_28._4_4_,(this->assign_).trail.ebo_.size) & 0xffffffff3fffffff;
  local_28.undo = (ConstraintDB *)0x0;
  bk_lib::pod_vector<Clasp::Solver::DLevel,_std::allocator<Clasp::Solver::DLevel>_>::push_back
            (&(this->levels_).super_type,&local_28);
  local_28._0_8_ = 0;
  bVar1 = Assignment::assign(&this->assign_,(Literal)p->rep_,(this->levels_).super_type.ebo_.size,
                             (Antecedent *)&local_28);
  return bVar1;
}

Assistant:

Var var() const { return rep_ >> sign_bit; }